

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O1

void __thiscall HEkkPrimal::updateDual(HEkkPrimal *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  HEkk *this_00;
  pointer pdVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x49,0);
  this_00 = this->ekk_instance_;
  iVar2 = this->variable_in;
  pdVar4 = (this_00->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->theta_dual = pdVar4[iVar2] / this->alpha_col;
  lVar7 = (long)(this->row_ap).count;
  if (0 < lVar7) {
    piVar5 = (this->row_ap).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->row_ap).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      iVar3 = piVar5[lVar8];
      pdVar4[iVar3] = pdVar4[iVar3] - this->theta_dual * pdVar6[iVar3];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  lVar7 = (long)(this->row_ep).count;
  if (0 < lVar7) {
    piVar5 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = this->num_col;
    lVar8 = 0;
    do {
      lVar9 = (long)piVar5[lVar8];
      lVar1 = iVar3 + lVar9;
      pdVar4[lVar1] = pdVar4[lVar1] - this->theta_dual * pdVar6[lVar9];
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  pdVar4[iVar2] = 0.0;
  pdVar4[this->variable_out] = -this->theta_dual;
  HEkk::invalidateDualInfeasibilityRecord(this_00);
  (this->ekk_instance_->status_).has_dual_objective_value = false;
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x49,0);
  return;
}

Assistant:

void HEkkPrimal::updateDual() {
  analysis->simplexTimerStart(UpdateDualClock);
  assert(alpha_col);
  assert(row_out >= 0);
  vector<double>& workDual = ekk_instance_.info_.workDual_;
  //  const vector<HighsInt>& nonbasicMove =
  //  ekk_instance_.basis_.nonbasicMove_;
  // Update the duals
  theta_dual = workDual[variable_in] / alpha_col;
  for (HighsInt iEl = 0; iEl < row_ap.count; iEl++) {
    HighsInt iCol = row_ap.index[iEl];
    workDual[iCol] -= theta_dual * row_ap.array[iCol];
  }
  for (HighsInt iEl = 0; iEl < row_ep.count; iEl++) {
    HighsInt iRow = row_ep.index[iEl];
    HighsInt iCol = iRow + num_col;
    workDual[iCol] -= theta_dual * row_ep.array[iRow];
  }
  // Dual for the pivot
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;

  ekk_instance_.invalidateDualInfeasibilityRecord();
  // After dual update in primal simplex the dual objective value is not known
  ekk_instance_.status_.has_dual_objective_value = false;
  analysis->simplexTimerStop(UpdateDualClock);
}